

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

void Cmd_addslot(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  PClass *p;
  PClassWeapon *type;
  FString FStack_28;
  FName local_1c;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 3) {
    pcVar3 = FCommandLine::operator[](argv,1);
    uVar2 = atoi(pcVar3);
    if (uVar2 < 10) {
      pcVar3 = FCommandLine::operator[](argv,2);
      local_1c.Index = FName::NameManager::FindName(&FName::NameData,pcVar3,true);
      p = PClass::FindClass(&local_1c);
      type = dyn_cast<PClassWeapon>((DObject *)p);
      if (type == (PClassWeapon *)0x0) {
        pcVar3 = FCommandLine::operator[](argv,2);
        Printf("%s is not a weapon\n",pcVar3);
      }
      else if (ParsingKeyConf == true) {
        FString::FString(&FStack_28,argv->cmd);
        TArray<FString,_FString>::Grow(&KeyConfWeapons,1);
        FString::AttachToOther(KeyConfWeapons.Array + KeyConfWeapons.Count,&FStack_28);
        KeyConfWeapons.Count = KeyConfWeapons.Count + 1;
        FString::~FString(&FStack_28);
      }
      else if (PlayingKeyConf == (FWeaponSlots *)0x0) {
        Net_WriteByte('8');
        Net_WriteByte((BYTE)uVar2);
        Net_WriteWeapon(type);
      }
      else {
        FWeaponSlot::AddWeapon(PlayingKeyConf->Slots + uVar2,type);
      }
      return;
    }
  }
  Printf("Usage: addslot <slot> <weapon>\n");
  return;
}

Assistant:

CCMD (addslot)
{
	unsigned int slot;

	if (argv.argc() != 3 || (slot = atoi (argv[1])) >= NUM_WEAPON_SLOTS)
	{
		Printf ("Usage: addslot <slot> <weapon>\n");
		return;
	}

	PClassWeapon *type= dyn_cast<PClassWeapon>(PClass::FindClass(argv[2]));
	if (type == NULL)
	{
		Printf("%s is not a weapon\n", argv[2]);
		return;
	}

	if (ParsingKeyConf)
	{
		KeyConfWeapons.Push(argv.args());
	}
	else if (PlayingKeyConf != NULL)
	{
		PlayingKeyConf->AddSlot(int(slot), type, false);
	}
	else
	{
		Net_WriteByte(DEM_ADDSLOT);
		Net_WriteByte(slot);
		Net_WriteWeapon(type);
	}
}